

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
hta::detail::make_exception<const_char_*,_unsigned_long,_const_char_*>::operator()
          (make_exception<const_char_*,_unsigned_long,_const_char_*> *this,stringstream *msg,
          char *arg,unsigned_long args,char *args_1)

{
  ostream *poVar1;
  size_t sVar2;
  make_exception<const_char_*> local_29;
  
  poVar1 = (ostream *)(msg + 0x10);
  if (arg == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,arg,sVar2);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  make_exception<const_char_*>::operator()(&local_29,msg,args_1);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }